

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O0

int __thiscall
OSSLECDSA::verify(OSSLECDSA *this,PublicKey *publicKey,ByteString *originalData,
                 ByteString *signature,Type mechanism,void *param_5,size_t param_6)

{
  uint uVar1;
  int iVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  EC_KEY *eckey_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar3;
  undefined4 extraout_var;
  undefined8 extraout_RAX_02;
  size_t sVar5;
  undefined8 extraout_RAX_03;
  ECDSA_SIG *sig_00;
  undefined8 extraout_RAX_04;
  uchar *puVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  undefined8 extraout_RAX_05;
  ulong uVar9;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  int ret;
  BIGNUM *bn_s;
  BIGNUM *bn_r;
  uchar *s;
  ECDSA_SIG *sig;
  size_t len;
  EC_KEY *eckey;
  OSSLECPublicKey *pk;
  ByteString *in_stack_ffffffffffffff78;
  undefined1 local_1;
  long lVar4;
  
  if (mechanism == ECDSA) {
    uVar1 = (*(publicKey->super_Serialisable)._vptr_Serialisable[3])
                      (publicKey,OSSLECPublicKey::type);
    if ((uVar1 & 1) == 0) {
      softHSMLog(3,"verify",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                 ,0x9d,"Invalid key type supplied");
      local_1 = 0;
      uVar3 = extraout_RAX_00;
    }
    else {
      eckey_00 = OSSLECPublicKey::getOSSLKey((OSSLECPublicKey *)publicKey);
      if (eckey_00 == (EC_KEY *)0x0) {
        softHSMLog(3,"verify",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                   ,0xa7,"Could not get the OpenSSL public key");
        local_1 = 0;
        uVar3 = extraout_RAX_01;
      }
      else {
        uVar3 = EC_KEY_OpenSSL();
        EC_KEY_set_method(eckey_00,uVar3);
        iVar2 = (*(publicKey->super_Serialisable)._vptr_Serialisable[6])();
        lVar4 = CONCAT44(extraout_var,iVar2);
        if (lVar4 == 0) {
          softHSMLog(3,"verify",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                     ,0xc0,"Could not get the order length");
          local_1 = 0;
          uVar3 = extraout_RAX_02;
        }
        else {
          sVar5 = ByteString::size((ByteString *)0x1b3e8d);
          if (sVar5 == lVar4 * 2) {
            sig_00 = ECDSA_SIG_new();
            if (sig_00 == (ECDSA_SIG *)0x0) {
              softHSMLog(3,"verify",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                         ,0xcb,"Could not create an ECDSA_SIG object");
              local_1 = 0;
              uVar3 = extraout_RAX_04;
            }
            else {
              puVar6 = ByteString::const_byte_str(in_stack_ffffffffffffff78);
              pBVar7 = BN_bin2bn(puVar6,iVar2,(BIGNUM *)0x0);
              pBVar8 = BN_bin2bn(puVar6 + lVar4,iVar2,(BIGNUM *)0x0);
              if ((pBVar7 != (BIGNUM *)0x0) && (pBVar8 != (BIGNUM *)0x0)) {
                iVar2 = ECDSA_SIG_set0(sig_00,pBVar7,pBVar8);
                if (iVar2 != 0) {
                  puVar6 = ByteString::const_byte_str(in_stack_ffffffffffffff78);
                  sVar5 = ByteString::size((ByteString *)0x1b3fd8);
                  iVar2 = ECDSA_do_verify(puVar6,(int)sVar5,sig_00,(EC_KEY *)eckey_00);
                  if (iVar2 == 1) {
                    ECDSA_SIG_free(sig_00);
                    local_1 = 1;
                    uVar3 = extraout_RAX_07;
                  }
                  else {
                    if (iVar2 < 0) {
                      uVar9 = ERR_get_error();
                      softHSMLog(3,"verify",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                                 ,0xdc,"ECDSA verify failed (0x%08X)",uVar9);
                    }
                    ECDSA_SIG_free(sig_00);
                    local_1 = 0;
                    uVar3 = extraout_RAX_06;
                  }
                  goto LAB_001b4053;
                }
              }
              softHSMLog(3,"verify",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                         ,0xd4,"Could not add data to the ECDSA_SIG object");
              ECDSA_SIG_free(sig_00);
              local_1 = 0;
              uVar3 = extraout_RAX_05;
            }
          }
          else {
            softHSMLog(3,"verify",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                       ,0xc5,"Invalid buffer length");
            local_1 = 0;
            uVar3 = extraout_RAX_03;
          }
        }
      }
    }
  }
  else {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,0x96,"Invalid mechanism supplied (%i)",(ulong)mechanism);
    local_1 = 0;
    uVar3 = extraout_RAX;
  }
LAB_001b4053:
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),local_1);
}

Assistant:

bool OSSLECDSA::verify(PublicKey* publicKey, const ByteString& originalData,
		       const ByteString& signature, const AsymMech::Type mechanism,
		       const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::ECDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!publicKey->isOfType(OSSLECPublicKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLECPublicKey* pk = (OSSLECPublicKey*) publicKey;
	EC_KEY* eckey = pk->getOSSLKey();

	if (eckey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL public key");

		return false;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		ECDSA_set_method(eckey, FIPS_ecdsa_openssl());
	else
		ECDSA_set_method(eckey, ECDSA_OpenSSL());
#else
	ECDSA_set_method(eckey, ECDSA_OpenSSL());
#endif

#else
	EC_KEY_set_method(eckey, EC_KEY_OpenSSL());
#endif

	// Perform the verify operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	if (signature.size() != 2 * len)
	{
		ERROR_MSG("Invalid buffer length");
		return false;
	}
	ECDSA_SIG* sig = ECDSA_SIG_new();
	if (sig == NULL)
	{
		ERROR_MSG("Could not create an ECDSA_SIG object");
		return false;
	}
	const unsigned char *s = signature.const_byte_str();
	BIGNUM* bn_r = BN_bin2bn(s, len, NULL);
	BIGNUM* bn_s = BN_bin2bn(s + len, len, NULL);
	if (bn_r == NULL || bn_s == NULL ||
	    !ECDSA_SIG_set0(sig, bn_r, bn_s))
	{
		ERROR_MSG("Could not add data to the ECDSA_SIG object");
		ECDSA_SIG_free(sig);
		return false;
	}
	int ret = ECDSA_do_verify(originalData.const_byte_str(), originalData.size(), sig, eckey);
	if (ret != 1)
	{
		if (ret < 0)
			ERROR_MSG("ECDSA verify failed (0x%08X)", ERR_get_error());

		ECDSA_SIG_free(sig);
		return false;
	}

	ECDSA_SIG_free(sig);
	return true;
}